

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

void __thiscall QDirPrivate::clearCache(QDirPrivate *this,MetaDataClearing mode)

{
  FileCache *this_00;
  __pointer_type copy;
  QAbstractFileEngine *pQVar1;
  QAbstractFileEngine *pQVar2;
  pointer *__ptr;
  long in_FS_OFFSET;
  bool bVar3;
  QAbstractFileEngine *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->fileCache;
  if ((this->fileCache).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar3) goto LAB_0022b51c;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_0022b51c:
  if (mode == IncludingMetaData) {
    (this->fileCache).metaData.knownFlagsMask.
    super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = 0;
  }
  LOCK();
  (this->fileCache).fileListsInitialized._M_base._M_i = false;
  UNLOCK();
  QList<QString>::clear(&(this->fileCache).files);
  QList<QFileInfo>::clear(&(this->fileCache).fileInfos);
  QFileSystemEngine::createLegacyEngine
            ((QFileSystemEngine *)&local_28,&this->dirEntry,&(this->fileCache).metaData);
  pQVar2 = local_28;
  local_28 = (QAbstractFileEngine *)0x0;
  pQVar1 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  (this->fileEngine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = pQVar2;
  if (pQVar1 != (QAbstractFileEngine *)0x0) {
    (*pQVar1->_vptr_QAbstractFileEngine[1])();
  }
  if (local_28 != (QAbstractFileEngine *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  LOCK();
  copy = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QDirPrivate::clearCache(MetaDataClearing mode)
{
    QMutexLocker locker(&fileCache.mutex);
    if (mode == IncludingMetaData)
        fileCache.metaData.clear();
    fileCache.fileListsInitialized = false;
    fileCache.files.clear();
    fileCache.fileInfos.clear();
    fileEngine = QFileSystemEngine::createLegacyEngine(dirEntry, fileCache.metaData);
}